

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::LinearExprHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter> *this,int num_terms)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < num_terms) {
    iVar1 = num_terms;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadUInt
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *)this,
               **(uint **)(this + 8));
    TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}